

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttt.cpp
# Opt level: O2

void __thiscall ttt::Board::Print(Board *this)

{
  int iVar1;
  ostream *poVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  Board *pBVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Player to move: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->player);
  std::operator<<(poVar2,'\n');
  pBVar5 = this;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,(uint)(pBVar5->board)._M_elems[0]._M_elems[lVar3]);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)&std::cout,'\n');
    pBVar5 = (Board *)((pBVar5->board)._M_elems + 1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Status: ");
  iVar1 = GetStatus(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n\n");
  return;
}

Assistant:

void
Board::Print() const
{
    std::cout << "Player to move: " << static_cast<int>(player) << '\n';
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
            std::cout << static_cast<int>(board[i][j]) << ' ';
        std::cout << '\n';
    }
    std::cout << "Status: " << GetStatus() << "\n\n";
}